

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

HelicsTime helicsFederateRequestNextStep(HelicsFederate fed,HelicsError *err)

{
  Federate *this;
  FedObject *pFVar1;
  Time TVar2;
  HelicsTime local_10;
  
  pFVar1 = helics::getFedObject(fed,err);
  local_10 = -1.785e+39;
  if ((pFVar1 != (FedObject *)0x0) &&
     (this = (pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr, this != (Federate *)0x0)) {
    TVar2 = helics::Federate::requestTime(this,(Time)0x0);
    if (TVar2.internalTimeCode == 0x7fffffffffffffff) {
      local_10 = 9223372036.854774;
    }
    else {
      local_10 = (double)(TVar2.internalTimeCode % 1000000000) * 1e-09 +
                 (double)(TVar2.internalTimeCode / 1000000000);
    }
  }
  return local_10;
}

Assistant:

HelicsTime helicsFederateRequestNextStep(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto timeret = fedObj->requestNextStep();
        return (timeret < helics::Time::maxVal()) ? static_cast<double>(timeret) : HELICS_TIME_MAXTIME;
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
}